

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  ushort uVar2;
  RpcConnectionState *pRVar3;
  RpcClient *pRVar4;
  void *pvVar5;
  undefined8 uVar6;
  PointerReader other;
  undefined8 uVar7;
  size_t sVar8;
  byte bVar9;
  RpcPipeline *this_00;
  uint uVar10;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  RpcRequest *this_01;
  int __flags_00;
  undefined1 *puVar11;
  PromiseNode *ptrCopy;
  anon_union_400_1_a8a2e026_for_OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>_2
  *other_00;
  Refcounted *pRVar12;
  MessageSizeCounts MVar13;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  ForkedPromise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
  forkedPromise;
  undefined1 local_418 [112];
  undefined1 local_3a8 [416];
  Disposer *local_208;
  uint local_1f8;
  Exception local_1e8;
  StructBuilder local_58;
  
  this_01 = (RpcRequest *)CONCAT44(in_register_00000034,__fd);
  pRVar3 = (this_01->connectionState).ptr;
  if ((pRVar3->connection).tag != 1) {
    other_00 = &(pRVar3->connection).field_1;
    kj::Exception::Exception((Exception *)local_3a8,(Exception *)other_00);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_1e8,(Exception *)local_3a8);
    kj::Exception::Exception(&local_1e8,(Exception *)other_00);
    newBrokenPipeline((capnp *)local_418,&local_1e8);
    uVar7 = local_418._8_8_;
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)local_1e8.ownFile.content.ptr;
    local_418._8_8_ = (PromiseArena *)0x0;
    (this->super_RequestHook).brand = (void *)local_418._0_8_;
    (this->connectionState).disposer = (Disposer *)uVar7;
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    (this->target).disposer = (Disposer *)0x0;
    (this->target).ptr = (RpcClient *)0x0;
    kj::Exception::~Exception(&local_1e8);
    kj::Exception::~Exception((Exception *)local_3a8);
    return (ssize_t)this;
  }
  pRVar4 = (this_01->target).ptr;
  local_3a8._16_8_ = (this_01->callBuilder)._builder.pointers;
  local_3a8._0_8_ = (this_01->callBuilder)._builder.segment;
  local_3a8._8_8_ = (this_01->callBuilder)._builder.capTable;
  PointerBuilder::getStruct(&local_58,(PointerBuilder *)local_3a8,(StructSize)0x10001,(word *)0x0);
  (*(pRVar4->super_ClientHook)._vptr_ClientHook[10])(local_3a8,pRVar4);
  uVar7 = local_3a8._8_8_;
  if ((QuestionRef *)local_3a8._8_8_ == (QuestionRef *)0x0) {
    bVar9 = *(byte *)((long)(this_01->callBuilder)._builder.data + 0x10);
    sendInternal((SendInternalResult *)local_3a8,this_01,false);
    if ((bVar9 & 2) == 0) {
      local_418._32_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
      ;
      local_418._40_8_ = &DAT_00559a08;
      local_418[0x30] = true;
      local_418._49_3_ = 9;
      local_418._52_4_ = 0x20;
      kj::
      Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
      fork((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
            *)&local_1e8);
      pRVar3 = (this_01->connectionState).ptr;
      kj::_::
      ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
      addBranch((ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                 *)local_418);
      this_00 = (RpcPipeline *)operator_new(0x228);
      RpcPipeline::RpcPipeline
                (this_00,pRVar3,
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 local_3a8,
                 (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                  *)local_418);
      uVar7 = local_418._0_8_;
      puVar1 = &(this_00->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      if ((PromiseArenaMember *)local_418._0_8_ != (PromiseArenaMember *)0x0) {
        local_418._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7);
      }
      kj::_::
      ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>::
      addBranch((ForkHub<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                 *)local_418);
      uVar7 = local_3a8._16_8_;
      local_3a8._16_8_ = local_418._0_8_;
      local_418._0_8_ = (PromiseArenaMember *)0x0;
      if (((PromiseArenaMember *)uVar7 != (PromiseArenaMember *)0x0) &&
         (kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7), uVar7 = local_418._0_8_,
         (PromiseArenaMember *)local_418._0_8_ != (PromiseArenaMember *)0x0)) {
        local_418._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7);
      }
      sVar8 = local_1e8.ownFile.content.size_;
      pRVar12 = &this_00->super_Refcounted;
      if ((RpcPipeline *)local_1e8.ownFile.content.size_ != (RpcPipeline *)0x0) {
        local_1e8.ownFile.content.size_ = 0;
        (**((Disposer *)local_1e8.ownFile.content.ptr)->_vptr_Disposer)
                  (local_1e8.ownFile.content.ptr,
                   ((PipelineHook *)sVar8)->_vptr_PipelineHook[-2] +
                   (long)&((PipelineHook *)sVar8)->_vptr_PipelineHook);
      }
    }
    else {
      getDisabledPipeline();
      this_00 = (RpcPipeline *)local_1e8.ownFile.content.size_;
      pRVar12 = (Refcounted *)local_1e8.ownFile.content.ptr;
    }
    local_1e8.ownFile.content.ptr =
         (char *)kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2436:13)>
                 ::anon_class_1_0_00000001_for_func::operator();
    kj::_::PromiseDisposer::
    appendPromise<kj::_::SimpleTransformPromiseNode<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>,capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>&&)_1_>,kj::_::PromiseDisposer,capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::send()::_lambda(kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>&&)_1_,void*&>
              ((PromiseDisposer *)this,(OwnPromiseNode *)(local_3a8 + 0x10),
               (anon_class_1_0_00000001_for_func *)local_418,(void **)&local_1e8);
    uVar7 = local_3a8._16_8_;
    (this->super_RequestHook).brand = pRVar12;
    (this->connectionState).disposer = (Disposer *)this_00;
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    (this->target).disposer = (Disposer *)0x0;
    (this->target).ptr = (RpcClient *)0x0;
    if ((PromiseArenaMember *)local_3a8._16_8_ != (PromiseArenaMember *)0x0) {
      local_3a8._16_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar7);
    }
    uVar7 = local_3a8._8_8_;
    if ((QuestionRef *)local_3a8._8_8_ == (QuestionRef *)0x0) {
      return (ssize_t)this;
    }
    local_3a8._8_8_ = (QuestionRef *)0x0;
    (*(code *)((SegmentReader *)local_3a8._0_8_)->arena->_vptr_Arena)
              (local_3a8._0_8_,
               (((Refcounted *)uVar7)->super_Disposer)._vptr_Disposer[-2] +
               (long)(Refcounted *)uVar7);
    return (ssize_t)this;
  }
  local_418._24_8_ = local_3a8._0_8_;
  pvVar5 = (this_01->callBuilder)._builder.data;
  uVar6 = *(undefined8 *)((long)pvVar5 + 8);
  uVar2 = *(ushort *)((long)pvVar5 + 4);
  PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
  MVar13 = PointerReader::targetSize((PointerReader *)&local_1e8);
  local_418._64_8_ = MVar13.wordCount;
  local_418[0x38] = 1;
  local_418._72_4_ = MVar13.capCount;
  StructBuilder::asReader(&(this_01->callBuilder)._builder);
  if (local_1f8 < 0x82) {
    bVar9 = 0;
  }
  else {
    bVar9 = *(byte *)&local_208[2]._vptr_Disposer >> 1 & 1;
    if (local_1f8 != 0x82) {
      uVar10 = (*(byte *)&local_208[2]._vptr_Disposer & 4) << 6;
      goto LAB_00326314;
    }
  }
  uVar10 = 0;
LAB_00326314:
  __n_00 = (size_t)uVar2;
  puVar11 = local_418 + 0x38;
  (**(((Refcounted *)uVar7)->super_Disposer)._vptr_Disposer)
            (local_3a8,uVar7,uVar6,__n_00,puVar11,(ulong)(uVar10 | bVar9),local_58.segment._0_4_,
             local_58.capTable._0_4_,local_58.data._0_4_,local_58.pointers._0_4_,local_58._32_8_);
  __flags_00 = (int)puVar11;
  PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
  other.capTable._0_4_ = (int)local_418._88_8_;
  other.segment = (SegmentReader *)local_418._80_8_;
  other.capTable._4_4_ = SUB84(local_418._88_8_,4);
  other.pointer._0_4_ = (int)local_418._96_8_;
  other.pointer._4_4_ = SUB84(local_418._96_8_,4);
  other.nestingLimit = (int)local_418._104_8_;
  other._28_4_ = SUB84(local_418._104_8_,4);
  PointerBuilder::copyFrom((PointerBuilder *)local_3a8,other,false);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::send
            ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_3a8,__buf_00,__n_00,
             __flags_00);
  uVar6 = local_3a8._32_8_;
  if ((ArrayDisposer *)local_3a8._32_8_ != (ArrayDisposer *)0x0) {
    local_3a8._32_8_ = (ArrayDisposer *)0x0;
    (*(code *)**(undefined8 **)local_3a8._24_8_)
              (local_3a8._24_8_,(*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6);
  }
  (*(code *)((SegmentReader *)local_418._24_8_)->arena->_vptr_Arena)
            (local_418._24_8_,
             (((Refcounted *)uVar7)->super_Disposer)._vptr_Disposer[-2] + (long)(Refcounted *)uVar7)
  ;
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        bool noPromisePipelining = callBuilder.getNoPromisePipelining();

        auto sendResult = sendInternal(false);

        kj::Own<PipelineHook> pipeline;
        if (noPromisePipelining) {
          pipeline = getDisabledPipeline();
        } else {
          auto forkedPromise = sendResult.promise.fork();

          // The pipeline must get notified of resolution before the app does to maintain ordering.
          pipeline = kj::refcounted<RpcPipeline>(
              *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

          sendResult.promise = forkedPromise.addBranch();
        }

        auto appPromise = sendResult.promise.then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }